

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkingDirectory.cxx
# Opt level: O0

void __thiscall cmWorkingDirectory::cmWorkingDirectory(cmWorkingDirectory *this,string *newdir)

{
  string local_38 [32];
  string *local_18;
  string *newdir_local;
  cmWorkingDirectory *this_local;
  
  local_18 = newdir;
  newdir_local = &this->OldDir;
  std::__cxx11::string::string((string *)this);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this,local_38);
  std::__cxx11::string::~string(local_38);
  SetDirectory(this,local_18);
  return;
}

Assistant:

cmWorkingDirectory::cmWorkingDirectory(std::string const& newdir)
{
  this->OldDir = cmSystemTools::GetCurrentWorkingDirectory();
  this->SetDirectory(newdir);
}